

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_list.c
# Opt level: O1

unsigned_long list_pop(list_s *lst)

{
  list_node_s *plVar1;
  unsigned_long uVar2;
  _list_node_s *p_Var3;
  
  if ((lst == (list_s *)0x0) || (plVar1 = lst->tail, plVar1 == (list_node_s *)0x0)) {
    uVar2 = 0;
  }
  else {
    uVar2 = plVar1->value;
    if (lst->head == plVar1) {
      if (plVar1->key != (uchar *)0x0) {
        free(plVar1->key);
        lst->tail->key = (uchar *)0x0;
      }
      free(lst->tail);
      lst->head = (list_node_s *)0x0;
      p_Var3 = (_list_node_s *)0x0;
    }
    else {
      p_Var3 = plVar1->next;
      if (plVar1->key != (uchar *)0x0) {
        free(plVar1->key);
        lst->tail->key = (uchar *)0x0;
      }
      free(lst->tail);
    }
    lst->tail = p_Var3;
    lst->elements = lst->elements - 1;
  }
  return uVar2;
}

Assistant:

unsigned long list_pop(list_s *lst) {
    if (lst == NULL || lst->tail == NULL) {
        return 0;
    } else {
        unsigned long value = lst->tail->value;
        if (lst->head == lst->tail) { //if head = tail
            if (lst->tail->key != NULL) {
                free(lst->tail->key); //free key memory
                lst->tail->key = NULL; //set list_s key pointer to NULL
            }
            free(lst->tail); //free list_s element memory
            lst->head = NULL; //set list_s pointer to NULL
            lst->tail = NULL; //set list_s pointer to NULL
        } else {
            list_node_s *next = lst->tail->next;
            if (lst->tail->key != NULL) {
                free(lst->tail->key); //free key memory
                lst->tail->key = NULL; //set list_s key pointer to NULL
            }
            free(lst->tail);
            lst->tail = next;
        }
        --lst->elements;
        return value;
    }
}